

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O0

mu_queue * mu_queue_new(int limit)

{
  int iVar1;
  mu_queue *__s;
  int size;
  mu_queue *q;
  int limit_local;
  
  iVar1 = limit * 8 + 0x20;
  __s = (mu_queue *)malloc((long)iVar1);
  memset(__s,0,(long)iVar1);
  __s->limit = limit;
  return __s;
}

Assistant:

static mu_queue *mu_queue_new (int limit) {
	mu_queue *q;
	int size = offsetof (struct mu_queue_s, data) + sizeof (q->data[0]) * limit;
	q = (mu_queue *) malloc (size);
	memset ((void *) q, 0, size);
	q->limit = limit;
	return (q);
}